

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O1

void Vga_ManRollBack(Vta_Man_t *p,int nObjOld)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Vta_Obj_t *pVVar7;
  int *piVar8;
  Vec_Int_t *pVVar9;
  uint uVar10;
  Vta_Obj_t *pVVar11;
  long lVar12;
  Vta_Obj_t *pVVar13;
  int *piVar14;
  
  pVVar7 = p->pObjs;
  iVar1 = p->nObjs;
  if (nObjOld < iVar1) {
    piVar8 = p->pBins;
    pVVar13 = pVVar7 + nObjOld;
    do {
      iVar2 = pVVar13->iObj;
      iVar3 = pVVar13->iFrame;
      uVar10 = (uint)((iVar3 + iVar2 + 1) * (iVar3 + iVar2)) % (uint)p->nBins;
      iVar4 = piVar8[(int)uVar10];
      if (((long)iVar4 < 0) || (iVar5 = p->nObjs, iVar5 <= iVar4)) goto LAB_00622a42;
      piVar14 = piVar8 + (int)uVar10;
      if (iVar4 != 0 && pVVar7 != (Vta_Obj_t *)0x0) {
        pVVar11 = pVVar7 + iVar4;
        do {
          if ((pVVar11->iObj == iVar2) && (pVVar11->iFrame == iVar3)) break;
          iVar4 = pVVar11->iNext;
          if (((long)iVar4 < 0) || (iVar5 <= iVar4)) goto LAB_00622a42;
          piVar14 = &pVVar11->iNext;
          pVVar11 = (Vta_Obj_t *)0x0;
          if (iVar4 != 0) {
            pVVar11 = pVVar7 + iVar4;
          }
        } while (pVVar11 != (Vta_Obj_t *)0x0);
      }
      iVar2 = *piVar14;
      lVar12 = (long)iVar2;
      if ((lVar12 < 0) || (iVar5 <= iVar2)) goto LAB_00622a42;
      if ((pVVar7 == (Vta_Obj_t *)0x0) || (iVar2 == 0)) {
        __assert_fail("pThis != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                      ,0x145,"void Vga_ManDelete(Vta_Man_t *, int, int)");
      }
      *piVar14 = pVVar7[lVar12].iNext;
      pVVar7[lVar12].iNext = -1;
      pVVar13 = pVVar13 + 1;
    } while (pVVar13 < pVVar7 + iVar1);
  }
  memset(pVVar7 + nObjOld,0,((long)p->nObjs - (long)nObjOld) * 0x10);
  p->nObjs = nObjOld;
  pVVar9 = p->vAddedNew;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      uVar10 = pVVar9->pArray[lVar12];
      if ((int)uVar10 < p->nObjs) {
        if ((int)uVar10 < 0) {
LAB_00622a42:
          __assert_fail("i >= 0 && i < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                        ,0x68,"Vta_Obj_t *Vta_ManObj(Vta_Man_t *, int)");
        }
        uVar6 = *(uint *)&p->pObjs[uVar10].field_0xc;
        if ((uVar6 >> 0x1e & 1) == 0) {
          __assert_fail("pThis->fAdded == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                        ,0x558,"void Vga_ManRollBack(Vta_Man_t *, int)");
        }
        *(uint *)&p->pObjs[uVar10].field_0xc = uVar6 & 0xbfffffff;
      }
      lVar12 = lVar12 + 1;
      pVVar9 = p->vAddedNew;
    } while (lVar12 < pVVar9->nSize);
  }
  return;
}

Assistant:

void Vga_ManRollBack( Vta_Man_t * p, int nObjOld )
{
    Vta_Obj_t * pThis  = p->pObjs + nObjOld;
    Vta_Obj_t * pLimit = p->pObjs + p->nObjs;
    int i, Entry;
    for ( ; pThis < pLimit; pThis++ )
        Vga_ManDelete( p, pThis->iObj, pThis->iFrame );
    memset( p->pObjs + nObjOld, 0, sizeof(Vta_Obj_t) * (p->nObjs - nObjOld) );
    p->nObjs = nObjOld;
    Vec_IntForEachEntry( p->vAddedNew, Entry, i )
        if ( Entry < p->nObjs )
        {
            pThis = Vta_ManObj(p, Entry);
            assert( pThis->fAdded == 1 );
            pThis->fAdded = 0;
        }
}